

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checksum.c
# Opt level: O1

int ffpcks(fitsfile *fptr,int *status)

{
  double dVar1;
  unsigned_long uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  LONGLONG headstart;
  unsigned_long sum;
  LONGLONG datastart;
  unsigned_long dsum;
  LONGLONG dataend;
  char checksum [71];
  char chkcomm [73];
  char datestr [20];
  char datasum [71];
  char datacomm [73];
  char comm [73];
  LONGLONG local_210;
  ulong local_208;
  long local_200;
  unsigned_long local_1f8;
  long local_1f0;
  long local_1e8;
  long lStack_1e0;
  char local_1d8;
  char local_198 [80];
  char local_148 [32];
  char local_128 [80];
  char local_d8 [80];
  char local_88 [88];
  
  if (0 < *status) {
    return *status;
  }
  ffgstm(local_148,(int *)0x0,status);
  builtin_strncpy(local_198 + 0x10,"ated ",6);
  builtin_strncpy(local_198,"HDU checksum upd",0x10);
  strcat(local_198,local_148);
  builtin_strncpy(local_d8,"data unit checksum updated ",0x1c);
  strcat(local_d8,local_148);
  iVar4 = *status;
  iVar3 = ffgkys(fptr,"CHECKSUM",(char *)&local_1e8,local_88,status);
  if (iVar3 == 0xca) {
    *status = iVar4;
    local_1e8._0_1_ = '0';
    local_1e8._1_1_ = '0';
    local_1e8._2_1_ = '0';
    local_1e8._3_1_ = '0';
    local_1e8._4_1_ = '0';
    local_1e8._5_1_ = '0';
    local_1e8._6_1_ = '0';
    local_1e8._7_1_ = '0';
    lStack_1e0._0_1_ = '0';
    lStack_1e0._1_1_ = '0';
    lStack_1e0._2_1_ = '0';
    lStack_1e0._3_1_ = '0';
    lStack_1e0._4_1_ = '0';
    lStack_1e0._5_1_ = '0';
    lStack_1e0._6_1_ = '0';
    lStack_1e0._7_1_ = '0';
    local_1d8 = '\0';
    ffpkys(fptr,"CHECKSUM",(char *)&local_1e8,local_198,status);
  }
  iVar4 = *status;
  iVar3 = ffgkys(fptr,"DATASUM",local_128,local_88,status);
  if (iVar3 == 0xca) {
    *status = iVar4;
    ffpkys(fptr,"DATASUM","         0",local_d8,status);
    if ((local_1d8 != '\0' || local_1e8 != 0x3030303030303030) || lStack_1e0 != 0x3030303030303030)
    {
      local_1e8._0_1_ = '0';
      local_1e8._1_1_ = '0';
      local_1e8._2_1_ = '0';
      local_1e8._3_1_ = '0';
      local_1e8._4_1_ = '0';
      local_1e8._5_1_ = '0';
      local_1e8._6_1_ = '0';
      local_1e8._7_1_ = '0';
      lStack_1e0._0_1_ = '0';
      lStack_1e0._1_1_ = '0';
      lStack_1e0._2_1_ = '0';
      lStack_1e0._3_1_ = '0';
      lStack_1e0._4_1_ = '0';
      lStack_1e0._5_1_ = '0';
      lStack_1e0._6_1_ = '0';
      lStack_1e0._7_1_ = '0';
      local_1d8 = '\0';
      ffmkys(fptr,"CHECKSUM",(char *)&local_1e8,local_198,status);
    }
    uVar6 = 0;
  }
  else {
    dVar1 = atof(local_128);
    uVar6 = (long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f | (long)dVar1;
  }
  iVar4 = ffrdef(fptr,status);
  if (iVar4 < 1) {
    if (0 < fptr->Fptr->heapsize) {
      ffuptf(fptr,status);
    }
    iVar4 = ffpdfl(fptr,status);
    if (iVar4 < 1) {
      iVar4 = ffghadll(fptr,&local_210,&local_200,&local_1f0,status);
      if (iVar4 < 1) {
        uVar5 = local_1f0 - local_200;
        local_1f8 = 0;
        if (0xb3f < (long)uVar5) {
          ffmbyt(fptr,local_200,0,status);
          iVar4 = ffcsum(fptr,uVar5 / 0xb40,&local_1f8,status);
          if (0 < iVar4) goto LAB_00116281;
        }
        uVar2 = local_1f8;
        if (local_1f8 != uVar6) {
          snprintf(local_128,0x47,"%lu",local_1f8);
          ffmkys(fptr,"DATASUM",local_128,local_d8,status);
          if ((local_1d8 != '\0' || local_1e8 != 0x3030303030303030) ||
              lStack_1e0 != 0x3030303030303030) {
            local_1e8._0_1_ = '0';
            local_1e8._1_1_ = '0';
            local_1e8._2_1_ = '0';
            local_1e8._3_1_ = '0';
            local_1e8._4_1_ = '0';
            local_1e8._5_1_ = '0';
            local_1e8._6_1_ = '0';
            local_1e8._7_1_ = '0';
            lStack_1e0._0_1_ = '0';
            lStack_1e0._1_1_ = '0';
            lStack_1e0._2_1_ = '0';
            lStack_1e0._3_1_ = '0';
            lStack_1e0._4_1_ = '0';
            lStack_1e0._5_1_ = '0';
            lStack_1e0._6_1_ = '0';
            lStack_1e0._7_1_ = '0';
            local_1d8 = '\0';
            ffmkys(fptr,"CHECKSUM",(char *)&local_1e8,local_198,status);
          }
        }
        if ((local_1d8 != '\0' || local_1e8 != 0x3030303030303030) ||
            lStack_1e0 != 0x3030303030303030) {
          ffmbyt(fptr,local_210,0,status);
          local_208 = uVar2;
          iVar4 = ffcsum(fptr,(local_200 - local_210) / 0xb40,&local_208,status);
          if (((0 < iVar4) || (local_208 == 0)) || (local_208 == 0xffffffff)) goto LAB_00116281;
          ffmkys(fptr,"CHECKSUM","0000000000000000",local_198,status);
        }
        ffmbyt(fptr,local_210,0,status);
        local_208 = uVar2;
        iVar4 = ffcsum(fptr,(local_200 - local_210) / 0xb40,&local_208,status);
        if (iVar4 < 1) {
          ffesum(local_208,1,(char *)&local_1e8);
          ffmkys(fptr,"CHECKSUM",(char *)&local_1e8,"&",status);
        }
      }
    }
  }
LAB_00116281:
  return *status;
}

Assistant:

int ffpcks(fitsfile *fptr,      /* I - FITS file pointer                  */
           int *status)         /* IO - error status                      */
/*
   Create or update the checksum keywords in the CHDU.  These keywords
   provide a checksum verification of the FITS HDU based on the ASCII
   coded 1's complement checksum algorithm developed by Rob Seaman at NOAO.
*/
{
    char datestr[20], checksum[FLEN_VALUE], datasum[FLEN_VALUE];
    char  comm[FLEN_COMMENT], chkcomm[FLEN_COMMENT], datacomm[FLEN_COMMENT];
    int tstatus;
    long nrec;
    LONGLONG headstart, datastart, dataend;
    unsigned long dsum, olddsum, sum;
    double tdouble;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /* generate current date string and construct the keyword comments */
    ffgstm(datestr, NULL, status);
    strcpy(chkcomm, "HDU checksum updated ");
    strcat(chkcomm, datestr);
    strcpy(datacomm, "data unit checksum updated ");
    strcat(datacomm, datestr);

    /* write the CHECKSUM keyword if it does not exist */
    tstatus = *status;
    if (ffgkys(fptr, "CHECKSUM", checksum, comm, status) == KEY_NO_EXIST)
    {
        *status = tstatus;
        strcpy(checksum, "0000000000000000");
        ffpkys(fptr, "CHECKSUM", checksum, chkcomm, status);
    }

    /* write the DATASUM keyword if it does not exist */
    tstatus = *status;
    if (ffgkys(fptr, "DATASUM", datasum, comm, status) == KEY_NO_EXIST)
    {
        *status = tstatus;
        olddsum = 0;
        ffpkys(fptr, "DATASUM", "         0", datacomm, status);

        /* set the CHECKSUM keyword as undefined, if it isn't already */
        if (strcmp(checksum, "0000000000000000") )
        {
            strcpy(checksum, "0000000000000000");
            ffmkys(fptr, "CHECKSUM", checksum, chkcomm, status);
        }
    }
    else
    {
        /* decode the datasum into an unsigned long variable */

        /* olddsum = strtoul(datasum, 0, 10); doesn't work on SUN OS */

        tdouble = atof(datasum);
        olddsum = (unsigned long) tdouble;
    }

    /* close header: rewrite END keyword and following blank fill */
    /* and re-read the required keywords to determine the structure */
    if (ffrdef(fptr, status) > 0)
        return(*status);

    if ((fptr->Fptr)->heapsize > 0)
         ffuptf(fptr, status);  /* update the variable length TFORM values */

    /* write the correct data fill values, if they are not already correct */
    if (ffpdfl(fptr, status) > 0)
        return(*status);

    /* calc size of data unit, in FITS 2880-byte blocks */
    if (ffghadll(fptr, &headstart, &datastart, &dataend, status) > 0)
        return(*status);

    nrec = (long) ((dataend - datastart) / 2880);
    dsum = 0;

    if (nrec > 0)
    {
        /* accumulate the 32-bit 1's complement checksum */
        ffmbyt(fptr, datastart, REPORT_EOF, status);
        if (ffcsum(fptr, nrec, &dsum, status) > 0)
            return(*status);
    }

    if (dsum != olddsum)
    {
        /* update the DATASUM keyword with the correct value */ 
        snprintf(datasum, FLEN_VALUE, "%lu", dsum);
        ffmkys(fptr, "DATASUM", datasum, datacomm, status);

        /* set the CHECKSUM keyword as undefined, if it isn't already */
        if (strcmp(checksum, "0000000000000000") )
        {
            strcpy(checksum, "0000000000000000");
            ffmkys(fptr, "CHECKSUM", checksum, chkcomm, status);
        }
    }        

    if (strcmp(checksum, "0000000000000000") )
    {
        /* check if CHECKSUM is still OK; move to the start of the header */
        ffmbyt(fptr, headstart, REPORT_EOF, status);

        /* accumulate the header checksum into the previous data checksum */
        nrec = (long) ((datastart - headstart) / 2880);
        sum = dsum;
        if (ffcsum(fptr, nrec, &sum, status) > 0)
            return(*status);

        if (sum == 0 || sum == 0xFFFFFFFF)
           return(*status);            /* CHECKSUM is correct */

        /* Zero the CHECKSUM and recompute the new value */
        ffmkys(fptr, "CHECKSUM", "0000000000000000", chkcomm, status);
    }

    /* move to the start of the header */
    ffmbyt(fptr, headstart, REPORT_EOF, status);

    /* accumulate the header checksum into the previous data checksum */
    nrec = (long) ((datastart - headstart) / 2880);
    sum = dsum;
    if (ffcsum(fptr, nrec, &sum, status) > 0)
           return(*status);

    /* encode the COMPLEMENT of the checksum into a 16-character string */
    ffesum(sum, TRUE, checksum);

    /* update the CHECKSUM keyword value with the new string */
    ffmkys(fptr, "CHECKSUM", checksum, "&", status);

    return(*status);
}